

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O2

int lws_callback_all_protocol_vhost_args
              (lws_vhost *vh,lws_protocols *protocol,int reason,void *argp,size_t len)

{
  lws_context *context;
  lws_protocols *plVar1;
  lws *plVar2;
  lws_context_per_thread *plVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  
  context = vh->context;
  plVar3 = context->pt;
  uVar5 = (uint)context->count_threads;
  while (bVar6 = uVar5 != 0, uVar5 = uVar5 - 1, bVar6) {
    for (uVar4 = 0; uVar4 < plVar3->fds_count; uVar4 = uVar4 + 1) {
      plVar2 = wsi_from_fd(context,plVar3->fds[uVar4].fd);
      if (((plVar2 != (lws *)0x0) && ((plVar2->a).vhost == vh)) &&
         ((plVar1 = (plVar2->a).protocol, protocol == (lws_protocols *)0x0 || (plVar1 == protocol)))
         ) {
        (*plVar1->callback)(plVar2,reason,plVar2->user_space,argp,len);
      }
    }
    plVar3 = plVar3 + 1;
  }
  return 0;
}

Assistant:

int
lws_callback_all_protocol_vhost_args(struct lws_vhost *vh,
			  const struct lws_protocols *protocol, int reason,
			  void *argp, size_t len)
{
	struct lws_context *context = vh->context;
	struct lws_context_per_thread *pt = &context->pt[0];
	unsigned int n, m = context->count_threads;
	struct lws *wsi;

	while (m--) {
		for (n = 0; n < pt->fds_count; n++) {
			wsi = wsi_from_fd(context, pt->fds[n].fd);
			if (!wsi)
				continue;
			if (wsi->a.vhost == vh && (wsi->a.protocol == protocol ||
						 !protocol))
				wsi->a.protocol->callback(wsi, (enum lws_callback_reasons)reason,
						wsi->user_space, argp, len);
		}
		pt++;
	}

	return 0;
}